

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplewidgets.cpp
# Opt level: O0

QString * __thiscall QAccessibleDisplay::text(QAccessibleDisplay *this,Text t)

{
  double dVar1;
  bool bVar2;
  TextFormat TVar3;
  int iVar4;
  QLabel *pQVar5;
  ulong uVar6;
  QWidget *pQVar7;
  QLCDNumber *pQVar8;
  QStatusBar *pQVar9;
  QProgressBar *pQVar10;
  Text in_EDX;
  QAccessibleWidget *in_RSI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QLCDNumber *l;
  QLabel *label;
  QTextDocument doc;
  QString str;
  QString *in_stack_fffffffffffffea8;
  QWidget *this_00;
  QAccessibleWidget *this_01;
  undefined1 local_f0 [24];
  undefined1 local_d8 [24];
  undefined1 local_c0 [72];
  undefined1 *local_78;
  undefined1 *local_70;
  QAnyStringView *local_68;
  undefined1 *local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
  this_00 = in_RDI;
  this_01 = in_RSI;
  QString::QString((QString *)0x7ef02f);
  if (in_EDX == Name) {
    QAccessibleWidget::widget((QAccessibleWidget *)0x7ef059);
    QWidget::accessibleName(this_00);
    QString::operator=((QString *)in_RDI,in_stack_fffffffffffffea8);
    QString::~QString((QString *)0x7ef08b);
    bVar2 = QString::isEmpty((QString *)0x7ef098);
    if (bVar2) {
      (**(code **)(*(long *)in_RSI + 0x18))();
      pQVar5 = qobject_cast<QLabel*>((QObject *)0x7ef0b4);
      if (pQVar5 == (QLabel *)0x0) {
        (**(code **)(*(long *)in_RSI + 0x18))();
        pQVar8 = qobject_cast<QLCDNumber*>((QObject *)0x7ef246);
        if (pQVar8 == (QLCDNumber *)0x0) {
          (**(code **)(*(long *)in_RSI + 0x18))();
          pQVar9 = qobject_cast<QStatusBar*>((QObject *)0x7ef311);
          if (pQVar9 != (QStatusBar *)0x0) {
            (**(code **)(*(long *)in_RSI + 0x18))();
            qobject_cast<QStatusBar*>((QObject *)0x7ef32a);
            QStatusBar::currentMessage((QStatusBar *)this_00);
            goto LAB_007ef40d;
          }
        }
        else {
          (**(code **)(*(long *)in_RSI + 0x18))();
          qobject_cast<QLCDNumber*>((QObject *)0x7ef263);
          iVar4 = QLCDNumber::digitCount((QLCDNumber *)in_RDI);
          if (iVar4 == 0) {
            iVar4 = QLCDNumber::intValue((QLCDNumber *)in_RDI);
            QString::number((int)local_d8,iVar4);
            QString::operator=((QString *)in_RDI,in_stack_fffffffffffffea8);
            QString::~QString((QString *)0x7ef2fc);
          }
          else {
            dVar1 = QLCDNumber::value((QLCDNumber *)in_RDI);
            QString::number(dVar1,(char)local_c0,0x67);
            QString::operator=((QString *)in_RDI,in_stack_fffffffffffffea8);
            QString::~QString((QString *)0x7ef2ba);
          }
        }
      }
      else {
        (**(code **)(*(long *)in_RSI + 0x18))();
        qobject_cast<QLabel*>((QObject *)0x7ef0d1);
        QLabel::text((QLabel *)this_00);
        QString::operator=((QString *)in_RDI,in_stack_fffffffffffffea8);
        QString::~QString((QString *)0x7ef10a);
        TVar3 = QLabel::textFormat((QLabel *)in_RDI);
        if (TVar3 == RichText) {
LAB_007ef15f:
          local_78 = &DAT_aaaaaaaaaaaaaaaa;
          local_70 = &DAT_aaaaaaaaaaaaaaaa;
          QTextDocument::QTextDocument((QTextDocument *)&local_78,(QObject *)0x0);
          QTextDocument::setHtml((QString *)&local_78);
          QTextDocument::toPlainText();
          QString::operator=((QString *)in_RDI,in_stack_fffffffffffffea8);
          QString::~QString((QString *)0x7ef1da);
          QTextDocument::~QTextDocument((QTextDocument *)&local_78);
        }
        else {
          TVar3 = QLabel::textFormat((QLabel *)in_RDI);
          if (TVar3 == AutoText) {
            QAnyStringView::QAnyStringView((QAnyStringView *)in_RSI,(QString *)this_00);
            uVar6 = Qt::mightBeRichText(local_68);
            if ((uVar6 & 1) != 0) goto LAB_007ef15f;
          }
        }
        pQVar7 = QLabel::buddy((QLabel *)in_RDI);
        if (pQVar7 != (QWidget *)0x0) {
          qt_accStripAmp((QString *)this_01);
          QString::operator=((QString *)in_RDI,in_stack_fffffffffffffea8);
          QString::~QString((QString *)0x7ef22e);
        }
      }
    }
  }
  else if (in_EDX == Value) {
    (**(code **)(*(long *)in_RSI + 0x18))();
    pQVar10 = qobject_cast<QProgressBar*>((QObject *)0x7ef35f);
    if (pQVar10 != (QProgressBar *)0x0) {
      (**(code **)(*(long *)in_RSI + 0x18))();
      qobject_cast<QProgressBar*>((QObject *)0x7ef378);
      iVar4 = QProgressBar::value((QProgressBar *)0x7ef380);
      QString::number((int)local_f0,iVar4);
      QString::operator=((QString *)in_RDI,in_stack_fffffffffffffea8);
      QString::~QString((QString *)0x7ef3ad);
    }
  }
  bVar2 = QString::isEmpty((QString *)0x7ef3be);
  if (bVar2) {
    QAccessibleWidget::text(this_01,in_EDX);
    QString::operator=((QString *)in_RDI,in_stack_fffffffffffffea8);
    QString::~QString((QString *)0x7ef3f3);
  }
  QString::QString((QString *)in_RDI,in_stack_fffffffffffffea8);
LAB_007ef40d:
  QString::~QString((QString *)0x7ef41a);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QString *)this_00;
}

Assistant:

QString QAccessibleDisplay::text(QAccessible::Text t) const
{
    QString str;
    switch (t) {
    case QAccessible::Name:
        str = widget()->accessibleName();
        if (str.isEmpty()) {
            if (false) {
#if QT_CONFIG(label)
            } else if (qobject_cast<QLabel*>(object())) {
                QLabel *label = qobject_cast<QLabel*>(object());
                str = label->text();
#ifndef QT_NO_TEXTHTMLPARSER
                if (label->textFormat() == Qt::RichText
                    || (label->textFormat() == Qt::AutoText && Qt::mightBeRichText(str))) {
                    QTextDocument doc;
                    doc.setHtml(str);
                    str = doc.toPlainText();
                }
#endif
#ifndef QT_NO_SHORTCUT
                if (label->buddy())
                    str = qt_accStripAmp(str);
#endif
#endif // QT_CONFIG(label)
#if QT_CONFIG(lcdnumber)
            } else if (qobject_cast<QLCDNumber*>(object())) {
                QLCDNumber *l = qobject_cast<QLCDNumber*>(object());
                if (l->digitCount())
                    str = QString::number(l->value());
                else
                    str = QString::number(l->intValue());
#endif
#if QT_CONFIG(statusbar)
            } else if (qobject_cast<QStatusBar*>(object())) {
                return qobject_cast<QStatusBar*>(object())->currentMessage();
#endif
            }
        }
        break;
    case QAccessible::Value:
#if QT_CONFIG(progressbar)
        if (qobject_cast<QProgressBar*>(object()))
            str = QString::number(qobject_cast<QProgressBar*>(object())->value());
#endif
        break;
    default:
        break;
    }
    if (str.isEmpty())
        str = QAccessibleWidget::text(t);
    return str;
}